

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::BaseBuilder::_emit
          (BaseBuilder *this,InstId instId,Operand_ *o0,Operand_ *o1,Operand_ *o2,Operand_ *opExt)

{
  char *__s;
  Error EVar1;
  int iVar2;
  InstNode *this_00;
  undefined4 extraout_var;
  uint start;
  uint uVar3;
  uint32_t i;
  InstOptions options;
  uint32_t uVar4;
  ulong uVar5;
  InstId local_a8;
  InstOptions local_a4;
  RegOnly local_a0;
  Operand_ local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  uint32_t local_68;
  undefined8 local_64;
  undefined8 uStack_5c;
  uint32_t local_54;
  uint32_t uStack_50;
  uint32_t uStack_4c;
  uint32_t uStack_48;
  undefined8 local_44;
  uint32_t local_3c;
  
  uVar4 = (opExt->_signature)._bits;
  if (uVar4 == 0) {
    uVar3 = (uint)((o0->_signature)._bits != 0);
    if ((o1->_signature)._bits != 0) {
      uVar3 = 2;
    }
    start = 3;
    if ((o2->_signature)._bits == 0) {
      start = uVar3;
    }
  }
  else if (opExt[1]._signature._bits == 0) {
    start = 4;
  }
  else {
    start = 6 - (opExt[2]._signature._bits == 0);
  }
  options = (this->super_BaseEmitter)._forcedInstOptions | (this->super_BaseEmitter)._instOptions;
  if ((options & kReserved) != kNone) {
    if ((this->super_BaseEmitter)._code == (CodeHolder *)0x0) {
      return 5;
    }
    if (((this->super_BaseEmitter)._diagnosticOptions & kValidateIntermediate) != kNone) {
      local_98._signature._bits = (o0->_signature)._bits;
      local_98._baseId = o0->_baseId;
      local_98._data = *&o0->_data;
      local_88._0_4_ = o1->_signature;
      local_88._4_4_ = o1->_baseId;
      uStack_80 = *(undefined8 *)o1->_data;
      local_78._0_4_ = o2->_signature;
      local_78._4_4_ = o2->_baseId;
      uStack_70 = *(undefined8 *)o2->_data;
      local_64._0_4_ = opExt->_baseId;
      local_64._4_4_ = opExt->_data[0];
      uStack_5c = *(undefined8 *)(opExt->_data + 1);
      local_54 = opExt[1]._baseId;
      uStack_50 = opExt[1]._data[0];
      uStack_4c = opExt[1]._data[1];
      uStack_48 = opExt[2]._signature._bits;
      local_44._0_4_ = opExt[2]._baseId;
      local_44._4_4_ = opExt[2]._data[0];
      local_3c = opExt[2]._data[1];
      local_a0 = (this->super_BaseEmitter)._extraReg;
      local_a8 = instId;
      local_a4 = options;
      local_68 = uVar4;
      EVar1 = (*(this->super_BaseEmitter)._funcs.validate)
                        ((BaseInst *)&local_a8,&local_98,(ulong)start,
                         SUB14((this->super_BaseEmitter)._emitterType == kCompiler,0));
      if (EVar1 != 0) {
        EVar1 = EmitterUtils::logInstructionFailed
                          (&this->super_BaseEmitter,EVar1,instId,options,o0,o1,o2,opExt);
        return EVar1;
      }
    }
    options = options & ~kReserved;
  }
  uVar4 = (uint)(4 < start) * 2 + 4;
  this_00 = (InstNode *)ZoneAllocator::alloc(&this->_allocator,(ulong)(uVar4 * 0x10 + 0x40));
  __s = (this->super_BaseEmitter)._inlineComment;
  (this->super_BaseEmitter)._instOptions = kNone;
  (this->super_BaseEmitter)._inlineComment = (char *)0x0;
  if (this_00 == (InstNode *)0x0) {
    (this->super_BaseEmitter)._extraReg._signature = 0;
    (this->super_BaseEmitter)._extraReg._id = 0;
    EVar1 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
  }
  else {
    *(undefined8 *)this_00 = 0;
    *(undefined8 *)(this_00 + 8) = 0;
    this_00[0x10] = (InstNode)0x1;
    this_00[0x11] = (InstNode)(this->_nodeFlags | (kActsAsInst|kIsRemovable|kIsCode));
    *(undefined8 *)(this_00 + 0x14) = 0;
    *(undefined8 *)(this_00 + 0x1c) = 0;
    *(undefined8 *)(this_00 + 0x20) = 0;
    *(undefined8 *)(this_00 + 0x28) = 0;
    *(InstId *)(this_00 + 0x30) = instId;
    *(InstOptions *)(this_00 + 0x34) = options;
    *(undefined8 *)(this_00 + 0x38) = 0;
    this_00[0x13] = SUB41(uVar4,0);
    this_00[0x12] = SUB41(start,0);
    *(RegOnly *)(this_00 + 0x38) = (this->super_BaseEmitter)._extraReg;
    InstNode::setOp(this_00,0,o0);
    InstNode::setOp(this_00,1,o1);
    InstNode::setOp(this_00,2,o2);
    for (uVar5 = 3; uVar5 < start; uVar5 = uVar5 + 1) {
      InstNode::setOp(this_00,(uint32_t)uVar5,opExt);
      opExt = opExt + 1;
    }
    InstNode::resetOpRange(this_00,start,uVar4);
    if (__s != (char *)0x0) {
      strlen(__s);
      iVar2 = Zone::dup(&this->_dataZone,(int)__s);
      *(ulong *)(this_00 + 0x28) = CONCAT44(extraout_var,iVar2);
    }
    addNode(this,(BaseNode *)this_00);
    (this->super_BaseEmitter)._extraReg._signature = 0;
    (this->super_BaseEmitter)._extraReg._id = 0;
    EVar1 = 0;
  }
  return EVar1;
}

Assistant:

Error BaseBuilder::_emit(InstId instId, const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_* opExt) {
  uint32_t opCount = EmitterUtils::opCountFromEmitArgs(o0, o1, o2, opExt);
  InstOptions options = instOptions() | forcedInstOptions();

  if (Support::test(options, InstOptions::kReserved)) {
    if (ASMJIT_UNLIKELY(!_code))
      return DebugUtils::errored(kErrorNotInitialized);

#ifndef ASMJIT_NO_VALIDATION
    // Strict validation.
    if (hasDiagnosticOption(DiagnosticOptions::kValidateIntermediate)) {
      Operand_ opArray[Globals::kMaxOpCount];
      EmitterUtils::opArrayFromEmitArgs(opArray, o0, o1, o2, opExt);

      ValidationFlags validationFlags = isCompiler() ? ValidationFlags::kEnableVirtRegs : ValidationFlags::kNone;
      Error err = _funcs.validate(BaseInst(instId, options, _extraReg), opArray, opCount, validationFlags);

      if (ASMJIT_UNLIKELY(err)) {
#ifndef ASMJIT_NO_LOGGING
        return EmitterUtils::logInstructionFailed(this, err, instId, options, o0, o1, o2, opExt);
#else
        resetState();
        return reportError(err);
#endif
      }
    }
#endif

    // Clear instruction options that should never be part of a regular instruction.
    options &= ~InstOptions::kReserved;
  }

  uint32_t opCapacity = InstNode::capacityOfOpCount(opCount);
  ASMJIT_ASSERT(opCapacity >= InstNode::kBaseOpCapacity);

  InstNode* node = _allocator.allocT<InstNode>(InstNode::nodeSizeOfOpCapacity(opCapacity));
  const char* comment = inlineComment();

  resetInstOptions();
  resetInlineComment();

  if (ASMJIT_UNLIKELY(!node)) {
    resetExtraReg();
    return reportError(DebugUtils::errored(kErrorOutOfMemory));
  }

  node = new(Support::PlacementNew{node}) InstNode(this, instId, options, opCount, opCapacity);
  node->setExtraReg(extraReg());
  node->setOp(0, o0);
  node->setOp(1, o1);
  node->setOp(2, o2);
  for (uint32_t i = 3; i < opCount; i++)
    node->setOp(i, opExt[i - 3]);
  node->resetOpRange(opCount, opCapacity);

  if (comment)
    node->setInlineComment(static_cast<char*>(_dataZone.dup(comment, strlen(comment), true)));

  addNode(node);
  resetExtraReg();
  return kErrorOk;
}